

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::RegularExpression::doTokenOverlap(RegularExpression *this,Op *op,Token *token)

{
  opType oVar1;
  tokType tVar2;
  bool bVar3;
  int iVar4;
  uint ch;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RangeToken tempRange;
  RangeToken local_70;
  RangeToken *tok;
  
  oVar1 = op->fOpType;
  bVar3 = true;
  if (oVar1 == O_CHAR) {
    ch = (*op->_vptr_Op[2])(op);
  }
  else {
    if (oVar1 != O_STRING) {
      if (oVar1 != O_RANGE) {
        return true;
      }
      iVar4 = (*op->_vptr_Op[7])(op);
      tok = (RangeToken *)CONCAT44(extraout_var,iVar4);
      tVar2 = token->fTokenType;
      if (tVar2 == T_STRING) {
        iVar4 = (*token->_vptr_Token[8])(token);
        ch = (uint)*(ushort *)CONCAT44(extraout_var_02,iVar4);
        token = (Token *)tok;
      }
      else {
        if (tVar2 == T_RANGE) {
          RangeToken::RangeToken(&local_70,(tok->super_Token).fTokenType,this->fMemoryManager);
          RangeToken::mergeRanges(&local_70,(Token *)tok);
          RangeToken::intersectRanges(&local_70,(RangeToken *)token);
          RangeToken::~RangeToken(&local_70);
          return local_70.fElemCount != 0;
        }
        if (tVar2 != T_CHAR) {
          return true;
        }
        ch = (*token->_vptr_Token[9])(token);
        token = (Token *)tok;
      }
      goto LAB_0023e11c;
    }
    iVar4 = (*op->_vptr_Op[8])(op);
    ch = (uint)*(ushort *)CONCAT44(extraout_var_00,iVar4);
  }
  if (ch != 0) {
    tVar2 = token->fTokenType;
    if (tVar2 - T_RANGE < 2) {
LAB_0023e11c:
      bVar3 = RangeToken::match((RangeToken *)token,ch);
      return bVar3;
    }
    if (tVar2 == T_STRING) {
      iVar4 = (*token->_vptr_Token[8])(token);
      uVar5 = (uint)*(ushort *)CONCAT44(extraout_var_01,iVar4);
    }
    else {
      if (tVar2 != T_CHAR) {
        return true;
      }
      uVar5 = (*token->_vptr_Token[9])(token);
    }
    bVar3 = uVar5 == ch;
  }
  return bVar3;
}

Assistant:

bool RegularExpression::doTokenOverlap(const Op* op, Token* token)
{
    if(op->getOpType()==Op::O_RANGE)
    {
        RangeToken* t1=(RangeToken*)op->getToken();
        switch(token->getTokenType())
        {
        case Token::T_CHAR:
            return t1->match(token->getChar());
        case Token::T_STRING:
            return t1->match(*token->getString());
        case Token::T_RANGE:
            {
                try
                {
                    RangeToken tempRange(t1->getTokenType(), fMemoryManager);
                    tempRange.mergeRanges(t1);
                    tempRange.intersectRanges((RangeToken*)token);
                    return !tempRange.empty();
                }
                catch(RuntimeException&)
                {
                }
                break;
            }
        default:
            break;
        }
        return true;
    }

    XMLInt32 ch=0;
    if(op->getOpType()==Op::O_CHAR)
        ch=op->getData();
    else if(op->getOpType()==Op::O_STRING)
        ch=*op->getLiteral();

    if(ch!=0)
    {
        switch(token->getTokenType())
        {
        case Token::T_CHAR:
            return token->getChar()==ch;
        case Token::T_STRING:
            return *token->getString()==ch;
        case Token::T_RANGE:
        case Token::T_NRANGE:
            return ((RangeToken*)token)->match(ch);
        default:
            break;
        }
    }
    // in any other case, there is the chance that they overlap
    return true;
}